

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O1

void __thiscall TxOrphanage::EraseForBlock(TxOrphanage *this,CBlock *block)

{
  long lVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pCVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer ptVar9;
  bool bVar10;
  int iVar11;
  iterator iVar12;
  _Rb_tree_node_base *p_Var13;
  Logger *this_00;
  pointer psVar14;
  iterator __end2;
  CTxIn *txin;
  pointer __k;
  iterator __begin2;
  pointer wtxid;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  CTransactionRef *ptx;
  int nErased;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> vOrphanErase;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  vOrphanErase.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vOrphanErase.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vOrphanErase.
  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar14 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar14 != psVar2) {
    do {
      peVar3 = (psVar14->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar4 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__k = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start; __k != pCVar4; __k = __k + 1) {
        iVar12 = std::
                 _Rb_tree<COutPoint,_std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>,_std::_Select1st<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                 ::find(&(this->m_outpoint_to_orphan_it)._M_t,&__k->prevout);
        if ((_Rb_tree_header *)iVar12._M_node !=
            &(this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header) {
          for (p_Var13 = *(_Rb_tree_node_base **)(iVar12._M_node + 3);
              p_Var13 != (_Rb_tree_node_base *)&iVar12._M_node[2]._M_left;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            lVar5 = *(long *)(*(long *)(p_Var13 + 1) + 0x40);
            if (vOrphanErase.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                vOrphanErase.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
              ::_M_realloc_insert<transaction_identifier<true>const&>
                        ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                          *)&vOrphanErase,
                         (iterator)
                         vOrphanErase.
                         super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (transaction_identifier<true> *)(lVar5 + 0x59));
            }
            else {
              uVar6 = *(undefined8 *)
                       (((transaction_identifier<true> *)(lVar5 + 0x59))->m_wrapped).
                       super_base_blob<256U>.m_data._M_elems;
              uVar7 = *(undefined8 *)(lVar5 + 0x61);
              uVar8 = *(undefined8 *)(lVar5 + 0x71);
              *(undefined8 *)
               (((vOrphanErase.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
                m_data._M_elems + 0x10) = *(undefined8 *)(lVar5 + 0x69);
              *(undefined8 *)
               (((vOrphanErase.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
                m_data._M_elems + 0x18) = uVar8;
              *(undefined8 *)
               ((vOrphanErase.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
               m_data._M_elems = uVar6;
              *(undefined8 *)
               (((vOrphanErase.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
                m_data._M_elems + 8) = uVar7;
              vOrphanErase.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   vOrphanErase.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
      }
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar2);
  }
  ptVar9 = vOrphanErase.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (vOrphanErase.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      vOrphanErase.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    nErased = 0;
    wtxid = vOrphanErase.
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar11 = EraseTx(this,wtxid);
      nErased = nErased + iVar11;
      wtxid = wtxid + 1;
    } while (wtxid != ptVar9);
    this_00 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(this_00,TXPACKAGES,Debug);
    if (bVar10) {
      logging_function._M_str = "EraseForBlock";
      logging_function._M_len = 0xd;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<int>
                (logging_function,source_file,0xcf,TXPACKAGES,Debug,
                 (ConstevalFormatString<1U>)0x8209bc,&nErased);
    }
  }
  if (vOrphanErase.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vOrphanErase.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vOrphanErase.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vOrphanErase.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxOrphanage::EraseForBlock(const CBlock& block)
{
    std::vector<Wtxid> vOrphanErase;

    for (const CTransactionRef& ptx : block.vtx) {
        const CTransaction& tx = *ptx;

        // Which orphan pool entries must we evict?
        for (const auto& txin : tx.vin) {
            auto itByPrev = m_outpoint_to_orphan_it.find(txin.prevout);
            if (itByPrev == m_outpoint_to_orphan_it.end()) continue;
            for (auto mi = itByPrev->second.begin(); mi != itByPrev->second.end(); ++mi) {
                const CTransaction& orphanTx = *(*mi)->second.tx;
                vOrphanErase.push_back(orphanTx.GetWitnessHash());
            }
        }
    }

    // Erase orphan transactions included or precluded by this block
    if (vOrphanErase.size()) {
        int nErased = 0;
        for (const auto& orphanHash : vOrphanErase) {
            nErased += EraseTx(orphanHash);
        }
        LogDebug(BCLog::TXPACKAGES, "Erased %d orphan transaction(s) included or conflicted by block\n", nErased);
    }
}